

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arealight.hpp
# Opt level: O0

void uploadLH(int n_vert,float *buffer)

{
  float *data;
  int local_28;
  int local_24;
  int j;
  int i;
  float *texdata;
  float *buffer_local;
  int n_vert_local;
  
  data = (float *)operator_new__(0x38400000);
  for (local_24 = 0; local_24 < n_vert; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < 0xe1; local_28 = local_28 + 1) {
      data[local_28 * 0x100000 + local_24] = buffer[local_24 * 0xe1 + local_28];
    }
  }
  (*glad_glActiveTexture)(0x84c8);
  create_2D_float_texture_array(0x400,0x400,1,0xe1,data,0x2600,false);
  if (data != (float *)0x0) {
    operator_delete__(data);
  }
  return;
}

Assistant:

void uploadLH(int n_vert, const float* buffer)
{
	float* texdata = new float[1024 * 1024 * N_COEFFS];
	for (int i=0; i<n_vert; ++i)
		for (int j=0; j<N_COEFFS; ++j)
			texdata[j*1024*1024+i] = buffer[i*N_COEFFS+j];
	glActiveTexture(GL_TEXTURE8);
	create_2D_float_texture_array(1024, 1024, 1, N_COEFFS, texdata, GL_NEAREST);
	delete[] texdata;
}